

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test_content.h
# Opt level: O0

string * __thiscall data::master::test_filter(master *this,string *s)

{
  ulong uVar1;
  char *pcVar2;
  undefined1 *puVar3;
  string *in_RDX;
  string *in_RDI;
  size_t i;
  string *tmp;
  undefined8 local_28;
  
  std::__cxx11::string::string(in_RDI,in_RDX);
  for (local_28 = 0; uVar1 = std::__cxx11::string::size(), local_28 < uVar1; local_28 = local_28 + 1
      ) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
    if (*pcVar2 == 'a') {
      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
      *puVar3 = 0x62;
    }
    else if (*pcVar2 == 'b') {
      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
      *puVar3 = 0x61;
    }
  }
  return in_RDI;
}

Assistant:

std::string test_filter(std::string const &s)
		{
			std::string tmp = s;
			for(size_t i=0;i<tmp.size();i++) {
				switch(tmp[i]) {
				case 'a' : tmp[i]='b'; break;
				case 'b' : tmp[i]='a'; break;
				}
			}
			return tmp;
		}